

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask2_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  uVar1 = *in;
  *out = uVar1;
  uVar1 = in[1] << 2 | uVar1;
  *out = uVar1;
  uVar1 = in[2] << 4 | uVar1;
  *out = uVar1;
  uVar1 = in[3] << 6 | uVar1;
  *out = uVar1;
  uVar1 = in[4] << 8 | uVar1;
  *out = uVar1;
  uVar1 = in[5] << 10 | uVar1;
  *out = uVar1;
  uVar1 = in[6] << 0xc | uVar1;
  *out = uVar1;
  uVar1 = in[7] << 0xe | uVar1;
  *out = uVar1;
  uVar1 = in[8] << 0x10 | uVar1;
  *out = uVar1;
  uVar1 = in[9] << 0x12 | uVar1;
  *out = uVar1;
  uVar1 = in[10] << 0x14 | uVar1;
  *out = uVar1;
  uVar1 = in[0xb] << 0x16 | uVar1;
  *out = uVar1;
  uVar1 = in[0xc] << 0x18 | uVar1;
  *out = uVar1;
  uVar1 = in[0xd] << 0x1a | uVar1;
  *out = uVar1;
  uVar1 = in[0xe] << 0x1c | uVar1;
  *out = uVar1;
  *out = in[0xf] << 0x1e | uVar1;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask2_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 26;
  ++in;
  *out |= ((*in)) << 28;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  ++in;

  return out;
}